

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O3

DVector2 __thiscall AActor::Vec2Angle(AActor *this,double length,DAngle *angle,bool absolute)

{
  double x;
  double dVar1;
  double *pdVar2;
  int in_ECX;
  undefined7 in_register_00000011;
  double dVar3;
  double dVar4;
  _func_int **pp_Var5;
  DVector2 DVar6;
  
  pdVar2 = (double *)CONCAT71(in_register_00000011,absolute);
  x = angle[9].Degrees;
  if (in_ECX == 0) {
    dVar1 = angle[10].Degrees;
    dVar3 = FFastTrig::cos(&fasttrig,*pdVar2 * 11930464.711111112 + 6755399441055744.0);
    dVar4 = FFastTrig::sin(&fasttrig,*pdVar2 * 11930464.711111112 + 6755399441055744.0);
    DVar6 = P_GetOffsetPosition(x,dVar1,dVar3 * length,length * dVar4);
  }
  else {
    dVar3 = FFastTrig::cos(&fasttrig,*pdVar2 * 11930464.711111112 + 6755399441055744.0);
    dVar1 = angle[10].Degrees;
    dVar4 = FFastTrig::sin(&fasttrig,x);
    pp_Var5 = (_func_int **)(length * dVar3 + x);
    DVar6.Y = dVar3;
    DVar6.X = (double)pp_Var5;
    (this->super_DThinker).super_DObject._vptr_DObject = pp_Var5;
    (this->super_DThinker).super_DObject.Class = (PClass *)(length * dVar4 + dVar1);
  }
  return DVar6;
}

Assistant:

DVector2 Vec2Angle(double length, DAngle angle, bool absolute = false)
	{
		if (absolute)
		{
			return{ X() + length * angle.Cos(), Y() + length * angle.Sin() };
		}
		else
		{
			return P_GetOffsetPosition(X(), Y(), length*angle.Cos(), length*angle.Sin());
		}
	}